

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.h
# Opt level: O1

CPAccessResult at_s1e2_access(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,_Bool isread)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  
  uVar1 = (uint)env->features;
  if ((uVar1 >> 9 & 1) != 0) {
    return CP_ACCESS_OK;
  }
  if (env->aarch64 == 0) {
    uVar2 = env->uncached_cpsr & 0x1f;
    if (uVar2 == 0x10) {
      return CP_ACCESS_OK;
    }
    if (uVar2 != 0x16) {
      if (uVar2 == 0x1a) {
        return CP_ACCESS_OK;
      }
      if ((env->features >> 0x21 & 1) == 0) {
        return CP_ACCESS_OK;
      }
      bVar3 = uVar2 == 0x16;
      if (!bVar3) {
        bVar3 = ((env->cp15).scr_el3 & 1) == 0;
      }
      if ((uVar1 >> 0x1c & 1) != 0) {
        return CP_ACCESS_OK;
      }
      if (!bVar3) {
        return CP_ACCESS_OK;
      }
    }
  }
  else if ((~env->pstate & 0xc) != 0) {
    return CP_ACCESS_OK;
  }
  if (((env->cp15).scr_el3 & 1) != 0) {
    return CP_ACCESS_OK;
  }
  return CP_ACCESS_TRAP;
}

Assistant:

static inline int arm_feature(CPUARMState *env, int feature)
{
    return (env->features & (1ULL << feature)) != 0;
}